

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

ptr<std::vector<ptr<log_entry>_>_> __thiscall
nuraft::inmem_log_store::log_entries(inmem_log_store *this,ulong start,ulong end)

{
  long lVar1;
  long lVar2;
  _func_int *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  undefined8 *puVar7;
  ulong in_RCX;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  size_type sVar10;
  long lVar11;
  size_type __new_size;
  bool bVar12;
  ptr<log_entry> pVar13;
  ptr<std::vector<ptr<log_entry>_>_> pVar14;
  ptr<log_entry> src;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  ptr<log_entry> local_48;
  
  puVar7 = (undefined8 *)operator_new(0x28);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_ptr_inplace_00180010;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  *(undefined8 **)&(this->logs_)._M_t._M_impl = puVar7;
  (this->super_log_store)._vptr_log_store = (_func_int **)(puVar7 + 2);
  __new_size = in_RCX - end;
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  resize((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          *)(puVar7 + 2),__new_size);
  _Var9._M_pi = extraout_RDX;
  if (end < in_RCX) {
    lVar1 = start + 0x10;
    sVar10 = 0;
    do {
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)(start + 0x38));
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      lVar2 = *(long *)(start + 0x18);
      lVar8 = lVar2;
      lVar11 = lVar1;
      if (lVar2 != 0) {
        do {
          bVar12 = *(ulong *)(lVar8 + 0x20) < end;
          if (!bVar12) {
            lVar11 = lVar8;
          }
          lVar8 = *(long *)(lVar8 + 0x10 + (ulong)bVar12 * 8);
        } while (lVar8 != 0);
        if ((lVar11 == lVar1) || (end < *(ulong *)(lVar11 + 0x20))) {
          do {
            lVar8 = lVar2;
            lVar2 = *(long *)(lVar8 + 0x10);
          } while (*(long *)(lVar8 + 0x10) != 0);
          lVar11 = lVar1;
          if ((lVar8 != lVar1) && (lVar11 = lVar8, *(long *)(lVar8 + 0x20) != 0)) {
            lVar11 = lVar1;
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_50,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar11 + 0x30));
      pthread_mutex_unlock((pthread_mutex_t *)(start + 0x38));
      pVar13 = make_clone(&local_48);
      _Var5._M_pi = local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar4 = local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var9 = pVar13.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      p_Var3 = *(this->super_log_store)._vptr_log_store;
      local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + sVar10 * 0x10 + 8);
      p_Var3 = p_Var3 + sVar10 * 0x10;
      *(element_type **)p_Var3 = peVar4;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + 8) = _Var5._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var9._M_pi = extraout_RDX_00;
      }
      if (local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_01;
      }
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
        _Var9._M_pi = extraout_RDX_02;
      }
      sVar10 = sVar10 + 1;
      end = end + 1;
    } while (sVar10 != __new_size);
  }
  pVar14.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var9._M_pi;
  pVar14.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<std::vector<ptr<log_entry>_>_>)
         pVar14.
         super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< std::vector< ptr<log_entry> > >
    inmem_log_store::log_entries(ulong start, ulong end)
{
    ptr< std::vector< ptr<log_entry> > > ret =
        cs_new< std::vector< ptr<log_entry> > >();

    ret->resize(end - start);
    ulong cc=0;
    for (ulong ii = start ; ii < end ; ++ii) {
        ptr<log_entry> src = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            auto entry = logs_.find(ii);
            if (entry == logs_.end()) {
                entry = logs_.find(0);
                assert(0);
            }
            src = entry->second;
        }
        (*ret)[cc++] = make_clone(src);
    }
    return ret;
}